

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# allow.cpp
# Opt level: O1

string * cappuccino::to_string_abi_cxx11_(allow a)

{
  if (a - insert < 3) {
    return (string *)(&PTR_typeinfo_00247cd8)[a];
  }
  return (string *)allow_invalid_value_abi_cxx11_;
}

Assistant:

auto to_string(allow a) -> const std::string&
{
    switch (a)
    {
        case allow::insert_or_update:
            return allow_insert_or_update;
        case allow::insert:
            return allow_insert;
        case allow::update:
            return allow_update;
        default:
            return allow_invalid_value;
    }
}